

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O2

string * __thiscall
OpenMPScheduleClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPScheduleClause *this)

{
  OpenMPScheduleClauseModifier OVar1;
  OpenMPScheduleClauseKind OVar2;
  bool bVar3;
  string clause_string;
  allocator<char> aaStack_68 [8];
  ulong local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"schedule ",aaStack_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)aaStack_68,"(",(allocator<char> *)&local_48);
  OVar1 = this->modifier2;
  OVar2 = this->schedulekind;
  if (this->modifier1 < OMPC_SCHEDULE_MODIFIER_user) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  if (OVar1 < OMPC_SCHEDULE_MODIFIER_user) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  if (1 < local_60) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  if (OVar2 < OMPC_SCHEDULE_KIND_user) {
    std::__cxx11::string::append((char *)aaStack_68);
  }
  std::__cxx11::string::string((string *)&local_48,(string *)&this->chunk_size);
  bVar3 = std::operator!=(&local_48,"");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar3) {
    std::__cxx11::string::append((char *)aaStack_68);
    std::__cxx11::string::string((string *)&local_48,(string *)&this->chunk_size);
    std::__cxx11::string::append((string *)aaStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::string::append((char *)aaStack_68);
  if (3 < local_60) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)aaStack_68);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPScheduleClause::toString() {

    std::string result = "schedule ";
    std::string clause_string = "(";
    OpenMPScheduleClauseModifier modifier1 = this->getModifier1();
    OpenMPScheduleClauseModifier modifier2 = this->getModifier2();
    OpenMPScheduleClauseKind kind = this->getKind();
    switch (modifier1) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += "monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += "nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += "simd";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += ",monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += ",nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += ",simd";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1){
        clause_string += ":"; 
    }
    switch (kind) {
        case OMPC_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        case OMPC_SCHEDULE_KIND_dynamic:
            clause_string += "dynamic";
            break;
        case OMPC_SCHEDULE_KIND_guided:
            clause_string += "guided";
            break;
        case OMPC_SCHEDULE_KIND_auto:
            clause_string += "auto";
            break;
        case OMPC_SCHEDULE_KIND_runtime:
            clause_string += "runtime";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != ""){
        clause_string += ", ";
        clause_string += this->getChunkSize();
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}